

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
context_internal(context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *a_ctx)

{
  basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *a_ctx_local;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->ctx = a_ctx;
  delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  delimiter_set(&this->delim_set);
  line_buffer_state<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::line_buffer_state(&this->line_buffer);
  return;
}

Assistant:

context_internal(basic_context<string_type>& a_ctx)
        : ctx(a_ctx)
    {
    }